

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precision.cpp
# Opt level: O0

float verify_accuracy<float,sumlib::naive,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                (vector<distribution<float>,_std::allocator<distribution<float>_>_> *dists)

{
  long lVar1;
  bool bVar2;
  reference pdVar3;
  iterator __first;
  reference pfVar4;
  float fVar5;
  float local_f8;
  iterator iStack_d8;
  float x;
  iterator __end0_1;
  iterator __begin0_1;
  vector<float,_std::allocator<float>_> *__range1_1;
  naive<float> sum;
  float local_9c;
  float local_98;
  float local_94;
  ulong uStack_90;
  float deviation;
  uint64_t i;
  undefined1 local_78 [8];
  normal_distribution<float> nd;
  distribution<float> d;
  __normal_iterator<distribution<float>_*,_std::vector<distribution<float>,_std::allocator<distribution<float>_>_>_>
  local_48;
  iterator __end0;
  iterator __begin0;
  vector<distribution<float>,_std::allocator<distribution<float>_>_> *__range1;
  undefined1 local_28 [4];
  float total;
  vector<float,_std::allocator<float>_> numbers;
  vector<distribution<float>,_std::allocator<distribution<float>_>_> *dists_local;
  
  numbers.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)dists;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_28);
  __range1._4_4_ = 0.0;
  __end0 = std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::begin(dists);
  local_48._M_current =
       (distribution<float> *)
       std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::end(dists);
  while (bVar2 = __gnu_cxx::operator!=(&__end0,&local_48), bVar2) {
    pdVar3 = __gnu_cxx::
             __normal_iterator<distribution<float>_*,_std::vector<distribution<float>,_std::allocator<distribution<float>_>_>_>
             ::operator*(&__end0);
    nd._8_8_ = pdVar3->terms;
    lVar1 = pdVar3->mean;
    d.mean._0_4_ = (result_type)*(undefined8 *)&pdVar3->deviation;
    std::normal_distribution<float>::normal_distribution
              ((normal_distribution<float> *)local_78,0.0,(result_type)d.mean);
    for (uStack_90 = 0; uStack_90 < (ulong)nd._8_8_ >> 1; uStack_90 = uStack_90 + 1) {
      local_94 = std::normal_distribution<float>::operator()
                           ((normal_distribution<float> *)local_78,
                            (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                             *)&stack0x00000008);
      local_98 = (float)lVar1 + local_94;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)local_28,&local_98);
      local_9c = (float)lVar1 - local_94;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)local_28,&local_9c);
    }
    local_f8 = (float)(ulong)(nd._8_8_ * lVar1);
    __range1._4_4_ = local_f8 + __range1._4_4_;
    __gnu_cxx::
    __normal_iterator<distribution<float>_*,_std::vector<distribution<float>,_std::allocator<distribution<float>_>_>_>
    ::operator++(&__end0);
  }
  __first = std::vector<float,_std::allocator<float>_>::begin
                      ((vector<float,_std::allocator<float>_> *)local_28);
  sum._8_8_ = std::vector<float,_std::allocator<float>_>::end
                        ((vector<float,_std::allocator<float>_> *)local_28);
  std::
  shuffle<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             __first._M_current,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)sum._8_8_,
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&stack0x00000008);
  sumlib::naive<float>::naive((naive<float> *)&__range1_1);
  __end0_1 = std::vector<float,_std::allocator<float>_>::begin
                       ((vector<float,_std::allocator<float>_> *)local_28);
  iStack_d8 = std::vector<float,_std::allocator<float>_>::end
                        ((vector<float,_std::allocator<float>_> *)local_28);
  while (bVar2 = __gnu_cxx::operator!=(&__end0_1,&stack0xffffffffffffff28), bVar2) {
    pfVar4 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&__end0_1);
    sumlib::naive<float>::operator+=((naive<float> *)&__range1_1,*pfVar4);
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&__end0_1);
  }
  fVar5 = sumlib::naive<float>::get((naive<float> *)&__range1_1);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_28);
  return fVar5 - __range1._4_4_;
}

Assistant:

T verify_accuracy( vector<distribution<T>> dists, RNG rng ) {
    vector<T> numbers;
    T total = 0;
    for( distribution<T> d : dists ) {
        normal_distribution<T> nd( 0, d.deviation );

        for( uint64_t i = 0; i < (d.terms/2); i++ ) {
            T deviation = nd( rng );
            numbers.push_back( d.mean + deviation );
            numbers.push_back( d.mean - deviation );
        }

        total += d.terms * d.mean;
    }

    shuffle( numbers.begin(), numbers.end(), rng );

    SUMMER<T> sum;
    for( auto x : numbers )
        sum += x;

    return sum.get()-total;
}